

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O3

int __thiscall btMultiBodyJointLimitConstraint::getIslandIdB(btMultiBodyJointLimitConstraint *this)

{
  btMultiBody *pbVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  btMultiBodyLinkCollider *pbVar5;
  
  pbVar1 = (this->super_btMultiBodyConstraint).m_bodyB;
  iVar2 = -1;
  if (pbVar1 != (btMultiBody *)0x0) {
    pbVar5 = pbVar1->m_baseCollider;
    if (pbVar5 == (btMultiBodyLinkCollider *)0x0) {
      lVar3 = (long)(pbVar1->m_links).m_size;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          pbVar5 = *(btMultiBodyLinkCollider **)
                    ((long)((pbVar1->m_links).m_data)->m_jointTorque + lVar4 + 0x1c);
          if (pbVar5 != (btMultiBodyLinkCollider *)0x0) goto LAB_001c76a1;
          lVar4 = lVar4 + 600;
        } while (lVar3 * 600 - lVar4 != 0);
      }
    }
    else {
LAB_001c76a1:
      iVar2 = *(int *)(pbVar5 + 0xe4);
    }
  }
  return iVar2;
}

Assistant:

int btMultiBodyJointLimitConstraint::getIslandIdB() const
{
	if(m_bodyB)
	{
		btMultiBodyLinkCollider* col = m_bodyB->getBaseCollider();
		if (col)
			return col->getIslandTag();

		for (int i=0;i<m_bodyB->getNumLinks();i++)
		{
			col = m_bodyB->getLink(i).m_collider;
			if (col)
				return col->getIslandTag();
		}
	}
	return -1;
}